

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask5_8(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 1),_DAT_00191cf0);
  auVar1 = vpshufd_avx(auVar2,0xee);
  auVar1 = vpor_avx(auVar2,auVar1);
  auVar2 = vpshufd_avx(auVar1,0x55);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(in + 6);
  auVar2 = vpsllvd_avx2(auVar2,_DAT_0019d600);
  auVar1 = vpinsrd_avx(ZEXT416(auVar1._0_4_ | in[5] << 0x19 | *in),
                       (uint)(*(ulong *)(in + 6) >> 2) & 0x3fffffff,1);
  auVar1 = vpor_avx(auVar2,auVar1);
  *(long *)out = auVar1._0_8_;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask5_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (5 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;

  return out + 1;
}